

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_memory.c
# Opt level: O0

int archive_read_open_memory2(archive *a,void *buff,size_t size,size_t read_size)

{
  archive *_a;
  archive *in_RCX;
  long in_RDX;
  archive *in_RSI;
  archive *in_RDI;
  read_memory_data *mine;
  void *in_stack_ffffffffffffffc8;
  int local_4;
  
  _a = (archive *)malloc(0x20);
  if (_a == (archive *)0x0) {
    archive_set_error(in_RDI,0xc,"No memory");
    local_4 = -0x1e;
  }
  else {
    memset(_a,0,0x20);
    _a->vtable = (archive_vtable_conflict *)in_RSI;
    *(archive **)_a = in_RSI;
    *(long *)&_a->archive_format = *(long *)_a + in_RDX;
    _a->archive_format_name = (char *)in_RCX;
    archive_read_set_open_callback(in_RCX,(undefined1 *)_a);
    archive_read_set_read_callback(in_RCX,(archive_read_callback *)_a);
    archive_read_set_seek_callback(in_RCX,(archive_seek_callback *)_a);
    archive_read_set_skip_callback(in_RCX,(archive_skip_callback *)_a);
    archive_read_set_close_callback(in_RCX,(undefined1 *)_a);
    archive_read_set_callback_data(_a,in_stack_ffffffffffffffc8);
    local_4 = archive_read_open1(in_RSI);
  }
  return local_4;
}

Assistant:

int
archive_read_open_memory2(struct archive *a, void *buff,
    size_t size, size_t read_size)
{
	struct read_memory_data *mine;

	mine = (struct read_memory_data *)malloc(sizeof(*mine));
	if (mine == NULL) {
		archive_set_error(a, ENOMEM, "No memory");
		return (ARCHIVE_FATAL);
	}
	memset(mine, 0, sizeof(*mine));
	mine->start = mine->p = (unsigned char *)buff;
	mine->end = mine->start + size;
	mine->read_size = read_size;
	archive_read_set_open_callback(a, memory_read_open);
	archive_read_set_read_callback(a, memory_read);
	archive_read_set_seek_callback(a, memory_read_seek);
	archive_read_set_skip_callback(a, memory_read_skip);
	archive_read_set_close_callback(a, memory_read_close);
	archive_read_set_callback_data(a, mine);
	return (archive_read_open1(a));
}